

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

void jinit_huff_decoder(j_decompress_ptr cinfo)

{
  undefined8 *puVar1;
  long in_RDI;
  int i;
  huff_entropy_ptr entropy;
  int local_14;
  j_common_ptr in_stack_fffffffffffffff0;
  
  std_huff_tables(in_stack_fffffffffffffff0);
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x170);
  *(undefined8 **)(in_RDI + 0x250) = puVar1;
  *puVar1 = start_pass_huff_decoder;
  puVar1[1] = decode_mcu;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    puVar1[(long)local_14 + 0xc] = 0;
    puVar1[(long)local_14 + 8] = 0;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_huff_decoder(j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy;
  int i;

  /* Motion JPEG frames typically do not include the Huffman tables if they
     are the default tables.  Thus, if the tables are not set by the time
     the Huffman decoder is initialized (usually within the body of
     jpeg_start_decompress()), we set them to default values. */
  std_huff_tables((j_common_ptr)cinfo);

  entropy = (huff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(huff_entropy_decoder));
  cinfo->entropy = (struct jpeg_entropy_decoder *)entropy;
  entropy->pub.start_pass = start_pass_huff_decoder;
  entropy->pub.decode_mcu = decode_mcu;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    entropy->dc_derived_tbls[i] = entropy->ac_derived_tbls[i] = NULL;
  }
}